

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShiftedMieBondType.hpp
# Opt level: O2

void __thiscall
OpenMD::ShiftedMieBondType::ShiftedMieBondType
          (ShiftedMieBondType *this,RealType mySigma,RealType myEpsilon,int myNrep,int myMatt)

{
  double dVar1;
  double dVar2;
  
  (this->super_BondType)._vptr_BondType = (_func_int **)&PTR__BondType_002f3958;
  this->sigma = mySigma;
  this->epsilon = myEpsilon;
  this->n = myNrep;
  this->m = myMatt;
  dVar1 = pow(mySigma,(double)(myMatt - myNrep));
  dVar1 = log((dVar1 * (double)this->m) / (double)this->n);
  dVar1 = exp(dVar1);
  this->rS_ = dVar1;
  dVar1 = (double)this->n;
  dVar2 = (double)this->m;
  dVar2 = pow(dVar1 / dVar2,dVar2 / (double)(this->n - this->m));
  this->nmScale_ = (dVar2 * dVar1) / (double)(this->n - this->m);
  dVar1 = 1.0 / (this->rS_ / this->sigma);
  dVar2 = pow(dVar1,(double)this->n);
  dVar1 = pow(dVar1,(double)this->m);
  this->potS_ = (dVar2 - dVar1) * this->nmScale_ * this->epsilon;
  (this->super_BondType).r0 = this->rS_;
  return;
}

Assistant:

ShiftedMieBondType(RealType mySigma, RealType myEpsilon, int myNrep,
                       int myMatt) :
        BondType(0.0) {
      sigma   = mySigma;
      epsilon = myEpsilon;
      n       = myNrep;
      m       = myMatt;

      rS_ = exp(log(pow(sigma, m - n) * RealType(m) / n));

      nmScale_ = n * pow(RealType(n) / m, RealType(m) / (n - m)) / (n - m);

      RealType rss = rS_ / sigma;
      RealType rsi = 1.0 / rss;
      RealType rsn = pow(rsi, n);
      RealType rsm = pow(rsi, m);

      potS_ = nmScale_ * epsilon * (rsn - rsm);

      setEquilibriumBondLength(rS_);
    }